

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O3

SpatialMatrix * __thiscall
RigidBodyDynamics::Math::SpatialRigidBodyInertia::toMatrix(SpatialRigidBodyInertia *this)

{
  undefined8 *puVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  SpatialMatrix *result;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong local_48 [5];
  double local_20;
  undefined8 local_18;
  ulong uStack_10;
  undefined8 local_8;
  
  dVar2 = this->Ixx;
  dVar8 = this->Iyx;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = dVar2;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = this->Iyy
  ;
  dVar2 = this->Izx;
  dVar8 = this->Izy;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xc] = dVar2;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xd] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = dVar2;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[8] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0xe] =
       this->Izz;
  auVar6 = _DAT_00144260;
  local_20 = (this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  uVar4 = (ulong)DAT_00144260;
  uStack_10 = (ulong)local_20 ^ uVar4;
  auVar3 = *(undefined1 (*) [16])
            ((this->h).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array + 1);
  auVar9 = auVar3 ^ _DAT_00144260;
  lVar7 = 0;
  local_48[0] = 0;
  local_48[3] = auVar9._8_8_;
  local_18 = auVar3._0_8_;
  local_48[4] = 0;
  local_48[1] = auVar3._8_8_;
  auVar10._8_4_ = auVar9._0_4_;
  auVar10._0_8_ = local_48[1];
  auVar10._12_4_ = auVar9._4_4_;
  local_48[2] = auVar10._8_8_;
  local_8 = 0;
  do {
    uVar5 = *(undefined8 *)((long)local_48 + lVar7 + 8);
    puVar1 = (undefined8 *)
             ((long)(result->super_Matrix<double,_6,_6,_0,_6,_6>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                    array + lVar7 * 2 + 0x90);
    *puVar1 = *(undefined8 *)((long)local_48 + lVar7);
    puVar1[1] = uVar5;
    *(undefined8 *)
     ((long)(result->super_Matrix<double,_6,_6,_0,_6,_6>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array +
     lVar7 * 2 + 0xa0) = *(undefined8 *)((long)local_48 + lVar7 + 0x10);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  lVar7 = 0;
  local_48[0] = 0;
  local_48[4] = 0;
  local_48[2] = auVar9._0_8_;
  local_8 = 0;
  do {
    *(undefined1 (*) [16])
     ((long)(result->super_Matrix<double,_6,_6,_0,_6,_6>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array +
     lVar7 * 2 + 0x18) = *(undefined1 (*) [16])((long)local_48 + lVar7) ^ auVar6;
    *(ulong *)((long)(result->super_Matrix<double,_6,_6,_0,_6,_6>).
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                     array + lVar7 * 2 + 0x28) = *(ulong *)((long)local_48 + lVar7 + 0x10) ^ uVar4;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  dVar2 = this->m;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x15] = dVar2;
  dVar8 = dVar2 * 0.0;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x16] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x17] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1b] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1c] = dVar2;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x1d] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x21] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x22] = dVar8;
  (result->super_Matrix<double,_6,_6,_0,_6,_6>).
  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0x23] = dVar2;
  return result;
}

Assistant:

SpatialMatrix toMatrix() const {
		SpatialMatrix result;
		result(0,0) = Ixx; result(0,1) = Iyx; result(0,2) = Izx;
		result(1,0) = Iyx; result(1,1) = Iyy; result(1,2) = Izy;
		result(2,0) = Izx; result(2,1) = Izy; result(2,2) = Izz;

		result.block<3,3>(0,3) = VectorCrossMatrix(h);
		result.block<3,3>(3,0) = - VectorCrossMatrix(h);
		result.block<3,3>(3,3) = Matrix3d::Identity(3,3) * m;

		return result;
	}